

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodetxb.c
# Opt level: O1

void read_coeffs_reverse(aom_reader *r,TX_SIZE tx_size,TX_CLASS tx_class,int start_si,int end_si,
                        int16_t *scan,int bhl,uint8_t *levels,base_cdf_arr base_cdf,
                        br_cdf_arr br_cdf)

{
  long lVar1;
  undefined1 *puVar2;
  uint16_t *icdf;
  base_cdf_arr icdf_00;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  byte *pbVar18;
  int col;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  undefined4 in_register_00000084;
  bool bVar23;
  undefined4 in_stack_0000000c;
  
  if (-1 < start_si) {
    bVar11 = (byte)scan;
    lVar22 = (long)(1 << (bVar11 & 0x1f));
    lVar1 = lVar22 + 4;
    lVar17 = (long)(2 << (bVar11 & 0x1f));
    iVar6 = (int)lVar1;
    uVar14 = (ulong)(uint)start_si;
    do {
      sVar3 = *(short *)(CONCAT44(in_register_00000084,end_si) + uVar14 * 2);
      uVar20 = (uint)sVar3;
      iVar19 = (int)uVar20 >> (bVar11 & 0x1f);
      lVar10 = (long)(int)(uVar20 + iVar19 * 4);
      puVar2 = (undefined1 *)(CONCAT44(in_stack_0000000c,bhl) + lVar10);
      iVar8 = (uint)""[*(byte *)(CONCAT44(in_stack_0000000c,bhl) + 1 + lVar10)] +
              (uint)""[(byte)puVar2[lVar1]];
      if (tx_class == '\x02') {
        iVar8 = iVar8 + (uint)""[(byte)puVar2[3]] + (uint)""[(byte)puVar2[2]];
        pbVar18 = puVar2 + 4;
      }
      else if (tx_class == '\0') {
        iVar8 = iVar8 + (uint)""[(byte)puVar2[lVar17 + 8]] + (uint)""[(byte)puVar2[lVar22 + 5]];
        pbVar18 = puVar2 + 2;
      }
      else {
        iVar8 = iVar8 + (uint)""[(byte)puVar2[(long)(3 << (bVar11 & 0x1f)) + 0xc]] +
                        (uint)""[(byte)puVar2[lVar17 + 8]];
        pbVar18 = puVar2 + (long)(4 << (bVar11 & 0x1f)) + 0x10;
      }
      iVar13 = 0;
      if (uVar20 != 0 || tx_class != '\0') {
        uVar9 = iVar8 + (uint)""[*pbVar18] + 1 >> 1;
        if (3 < uVar9) {
          uVar9 = 4;
        }
        if (tx_class == '\x02') {
          uVar15 = (ulong)(uVar20 & ~(-1 << (bVar11 & 0x1f)));
LAB_00180f0b:
          iVar13 = nz_map_ctx_offset_1d[uVar15];
        }
        else {
          if (tx_class == '\x01') {
            uVar15 = (ulong)iVar19;
            goto LAB_00180f0b;
          }
          if (tx_class != '\0') goto LAB_00180f17;
          iVar13 = (int)av1_nz_map_ctx_offset[tx_size][(int)uVar20];
        }
        iVar13 = uVar9 + iVar13;
      }
LAB_00180f17:
      icdf = (uint16_t *)(levels + (long)iVar13 * 10);
      iVar8 = od_ec_decode_cdf_q15(&r->ec,icdf,4);
      if (r->allow_update_cdf != '\0') {
        uVar4 = icdf[4];
        bVar12 = (char)(uVar4 >> 4) + 5;
        lVar10 = 0;
        do {
          uVar5 = icdf[lVar10];
          if (lVar10 < (char)iVar8) {
            sVar7 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar12 & 0x1f));
          }
          else {
            sVar7 = -(uVar5 >> (bVar12 & 0x1f));
          }
          icdf[lVar10] = sVar7 + uVar5;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        icdf[4] = icdf[4] + (ushort)(uVar4 < 0x20);
      }
      if (2 < iVar8) {
        uVar16 = iVar19 << (bVar11 & 0x1f);
        iVar13 = uVar20 - uVar16;
        iVar21 = iVar19 * iVar6 + iVar13;
        uVar9 = (uint)*(byte *)(CONCAT44(in_stack_0000000c,bhl) + (long)(iVar21 + iVar6)) +
                (uint)*(byte *)(CONCAT44(in_stack_0000000c,bhl) + 1 + (long)iVar21);
        if (tx_class == '\x02') {
          uVar9 = uVar9 + *(byte *)(CONCAT44(in_stack_0000000c,bhl) + 2 + (long)iVar21) + 1 >> 1;
          if (5 < uVar9) {
            uVar9 = 6;
          }
          if (sVar3 != 0) {
            if (uVar20 != uVar16) goto LAB_001810aa;
            uVar9 = uVar9 + 7;
          }
        }
        else if (tx_class == '\x01') {
          uVar9 = uVar9 + *(byte *)(CONCAT44(in_stack_0000000c,bhl) + (long)(iVar21 + iVar6 * 2)) +
                  1 >> 1;
          if (5 < uVar9) {
            uVar9 = 6;
          }
          if (sVar3 != 0) {
            bVar23 = iVar19 == 0;
LAB_00181067:
            if (!bVar23) goto LAB_001810aa;
            uVar9 = uVar9 + 7;
          }
        }
        else if (tx_class == '\0') {
          uVar9 = uVar9 + *(byte *)(CONCAT44(in_stack_0000000c,bhl) + 1 + (long)(iVar21 + iVar6)) +
                  1 >> 1;
          if (5 < uVar9) {
            uVar9 = 6;
          }
          if (sVar3 != 0) {
            bVar23 = iVar19 < 2 && iVar13 < 2;
            goto LAB_00181067;
          }
        }
        else {
LAB_001810aa:
          uVar9 = uVar9 + 0xe;
        }
        icdf_00 = base_cdf + uVar9;
        uVar20 = 0 >> (bVar11 & 0x1f);
        do {
          iVar19 = od_ec_decode_cdf_q15(&r->ec,*icdf_00,4);
          if (r->allow_update_cdf != '\0') {
            uVar4 = (*icdf_00)[4];
            bVar12 = (char)(uVar4 >> 4) + 5;
            lVar10 = 0;
            do {
              uVar5 = (*icdf_00)[lVar10];
              if (lVar10 < (char)iVar19) {
                sVar3 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar12 & 0x1f));
              }
              else {
                sVar3 = -(uVar5 >> (bVar12 & 0x1f));
              }
              (*icdf_00)[lVar10] = sVar3 + uVar5;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            (*icdf_00)[4] = (*icdf_00)[4] + (ushort)(uVar4 < 0x20);
          }
          iVar8 = iVar8 + iVar19;
        } while ((2 < iVar19) && (bVar23 = uVar20 < 9, uVar20 = uVar20 + 3, bVar23));
      }
      *puVar2 = (char)iVar8;
      bVar23 = 0 < (long)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar23);
  }
  return;
}

Assistant:

static inline void read_coeffs_reverse(aom_reader *r, TX_SIZE tx_size,
                                       TX_CLASS tx_class, int start_si,
                                       int end_si, const int16_t *scan, int bhl,
                                       uint8_t *levels, base_cdf_arr base_cdf,
                                       br_cdf_arr br_cdf) {
  for (int c = end_si; c >= start_si; --c) {
    const int pos = scan[c];
    const int coeff_ctx =
        get_lower_levels_ctx(levels, pos, bhl, tx_size, tx_class);
    const int nsymbs = 4;
    int level = aom_read_symbol(r, base_cdf[coeff_ctx], nsymbs, ACCT_STR);
    if (level > NUM_BASE_LEVELS) {
      const int br_ctx = get_br_ctx(levels, pos, bhl, tx_class);
      aom_cdf_prob *cdf = br_cdf[br_ctx];
      for (int idx = 0; idx < COEFF_BASE_RANGE; idx += BR_CDF_SIZE - 1) {
        const int k = aom_read_symbol(r, cdf, BR_CDF_SIZE, ACCT_STR);
        level += k;
        if (k < BR_CDF_SIZE - 1) break;
      }
    }
    levels[get_padded_idx(pos, bhl)] = level;
  }
}